

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int64_t cfl_compute_rd(AV1_COMP *cpi,MACROBLOCK *x,int plane,TX_SIZE tx_size,BLOCK_SIZE plane_bsize,
                      int cfl_idx,int fast_mode,RD_STATS *rd_stats)

{
  int8_t iVar1;
  uint8_t uVar2;
  MB_MODE_INFO *pMVar3;
  char cVar4;
  int64_t iVar5;
  char cVar6;
  uint8_t uVar7;
  int iVar8;
  int iVar9;
  
  pMVar3 = *(x->e_mbd).mi;
  iVar9 = cfl_idx + -0x10;
  if (iVar9 == 0) {
    cVar6 = '\0';
    uVar7 = '\0';
  }
  else {
    cVar6 = (0x10 < cfl_idx) + '\x01';
    iVar8 = -iVar9;
    if (0 < iVar9) {
      iVar8 = iVar9;
    }
    uVar7 = (char)iVar8 * '\x11' + 0xef;
  }
  iVar1 = pMVar3->cfl_alpha_signs;
  cVar4 = cVar6 + '\x02';
  if ((char)plane == '\x01') {
    cVar4 = cVar6 * '\x03';
  }
  uVar2 = pMVar3->cfl_alpha_idx;
  pMVar3->cfl_alpha_signs = cVar4;
  pMVar3->cfl_alpha_idx = uVar7;
  if (fast_mode == 0) {
    rd_stats->rate = 0;
    rd_stats->zero_rate = 0;
    rd_stats->dist = 0;
    rd_stats->rdcost = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = '\x01';
    av1_txfm_rd_in_plane(x,cpi,rd_stats,0x7fffffffffffffff,0,plane,plane_bsize,tx_size,'\0',0);
    av1_rd_cost_update(x->rdmult,rd_stats);
    iVar5 = rd_stats->rdcost;
  }
  else {
    iVar5 = intra_model_rd(&cpi->common,x,plane,plane_bsize,tx_size,0);
  }
  pMVar3->cfl_alpha_signs = iVar1;
  pMVar3->cfl_alpha_idx = uVar2;
  return iVar5;
}

Assistant:

static int64_t cfl_compute_rd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              int plane, TX_SIZE tx_size,
                              BLOCK_SIZE plane_bsize, int cfl_idx,
                              int fast_mode, RD_STATS *rd_stats) {
  assert(IMPLIES(fast_mode, rd_stats == NULL));
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int cfl_plane = get_cfl_pred_type(plane);
  CFL_SIGN_TYPE cfl_sign;
  int cfl_alpha;
  cfl_idx_to_sign_and_alpha(cfl_idx, &cfl_sign, &cfl_alpha);
  // We conly build CFL for a given plane, the other plane's sign is dummy
  int dummy_sign = CFL_SIGN_NEG;
  const int8_t orig_cfl_alpha_signs = mbmi->cfl_alpha_signs;
  const uint8_t orig_cfl_alpha_idx = mbmi->cfl_alpha_idx;
  mbmi->cfl_alpha_signs =
      PLANE_SIGN_TO_JOINT_SIGN(cfl_plane, cfl_sign, dummy_sign);
  mbmi->cfl_alpha_idx = (cfl_alpha << CFL_ALPHABET_SIZE_LOG2) + cfl_alpha;
  int64_t cfl_cost;
  if (fast_mode) {
    cfl_cost =
        intra_model_rd(cm, x, plane, plane_bsize, tx_size, /*use_hadamard=*/0);
  } else {
    av1_init_rd_stats(rd_stats);
    av1_txfm_rd_in_plane(x, cpi, rd_stats, INT64_MAX, 0, plane, plane_bsize,
                         tx_size, FTXS_NONE, 0);
    av1_rd_cost_update(x->rdmult, rd_stats);
    cfl_cost = rd_stats->rdcost;
  }
  mbmi->cfl_alpha_signs = orig_cfl_alpha_signs;
  mbmi->cfl_alpha_idx = orig_cfl_alpha_idx;
  return cfl_cost;
}